

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

char * __thiscall
ImFont::CalcWordWrapPositionA(ImFont *this,float scale,char *text,char *text_end,float wrap_width)

{
  int iVar1;
  float *pfVar2;
  char *in_text;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  uint c;
  float local_54;
  uint local_48;
  float local_44;
  char *local_40;
  float *local_38;
  
  local_44 = wrap_width / scale;
  local_38 = &this->FallbackAdvanceX;
  bVar5 = true;
  fVar6 = 0.0;
  local_40 = (char *)0x0;
  fVar7 = 0.0;
  local_54 = 0.0;
  pcVar3 = text;
LAB_001882cb:
  do {
    in_text = text;
    if (text_end <= in_text) {
      return in_text;
    }
    local_48 = (uint)*in_text;
    if (*in_text < '\0') {
      iVar1 = ImTextCharFromUtf8(&local_48,in_text,text_end);
      text = in_text + iVar1;
    }
    else {
      text = in_text + 1;
    }
    if (local_48 == 0) {
      return in_text;
    }
    if (local_48 < 0x20) {
      if (local_48 == 10) {
        bVar5 = true;
        fVar6 = 0.0;
        fVar7 = 0.0;
        local_54 = 0.0;
        goto LAB_001882cb;
      }
      if (local_48 == 0xd) goto LAB_001882cb;
    }
    pfVar2 = local_38;
    if ((int)local_48 < (this->IndexAdvanceX).Size) {
      pfVar2 = ImVector<float>::operator[](&this->IndexAdvanceX,local_48);
    }
    if (((local_48 == 9) || (local_48 == 0x3000)) || (local_48 == 0x20)) {
      if (bVar5) {
        fVar6 = fVar6 + local_54;
      }
      pcVar4 = pcVar3;
      if (bVar5) {
        pcVar4 = in_text;
        local_54 = 0.0;
      }
      local_54 = local_54 + *pfVar2;
      bVar5 = false;
    }
    else {
      fVar7 = fVar7 + *pfVar2;
      pcVar4 = text;
      if (!bVar5) {
        fVar6 = fVar6 + local_54 + fVar7;
        fVar7 = 0.0;
        local_54 = 0.0;
        pcVar4 = pcVar3;
        local_40 = pcVar3;
      }
      if ((local_48 < 0x40) && ((0x8800500200000000U >> ((ulong)local_48 & 0x3f) & 1) != 0)) {
        bVar5 = false;
      }
      else {
        bVar5 = local_48 != 0x22;
      }
    }
    pcVar3 = pcVar4;
    if (local_44 <= fVar6 + fVar7) {
      if (local_40 != (char *)0x0) {
        pcVar4 = local_40;
      }
      if (fVar7 < local_44) {
        in_text = pcVar4;
      }
      return in_text;
    }
  } while( true );
}

Assistant:

const char* ImFont::CalcWordWrapPositionA(float scale, const char* text, const char* text_end, float wrap_width) const
{
    // Simple word-wrapping for English, not full-featured. Please submit failing cases!
    // FIXME: Much possible improvements (don't cut things like "word !", "word!!!" but cut within "word,,,,", more sensible support for punctuations, support for Unicode punctuations, etc.)

    // For references, possible wrap point marked with ^
    //  "aaa bbb, ccc,ddd. eee   fff. ggg!"
    //      ^    ^    ^   ^   ^__    ^    ^

    // List of hardcoded separators: .,;!?'"

    // Skip extra blanks after a line returns (that includes not counting them in width computation)
    // e.g. "Hello    world" --> "Hello" "World"

    // Cut words that cannot possibly fit within one line.
    // e.g.: "The tropical fish" with ~5 characters worth of width --> "The tr" "opical" "fish"

    float line_width = 0.0f;
    float word_width = 0.0f;
    float blank_width = 0.0f;
    wrap_width /= scale; // We work with unscaled widths to avoid scaling every characters

    const char* word_end = text;
    const char* prev_word_end = NULL;
    bool inside_word = true;

    const char* s = text;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)*s;
        const char* next_s;
        if (c < 0x80)
            next_s = s + 1;
        else
            next_s = s + ImTextCharFromUtf8(&c, s, text_end);
        if (c == 0)
            break;

        if (c < 32)
        {
            if (c == '\n')
            {
                line_width = word_width = blank_width = 0.0f;
                inside_word = true;
                s = next_s;
                continue;
            }
            if (c == '\r')
            {
                s = next_s;
                continue;
            }
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX[(int)c] : FallbackAdvanceX);
        if (ImCharIsSpace(c))
        {
            if (inside_word)
            {
                line_width += blank_width;
                blank_width = 0.0f;
                word_end = s;
            }
            blank_width += char_width;
            inside_word = false;
        }
        else
        {
            word_width += char_width;
            if (inside_word)
            {
                word_end = next_s;
            }
            else
            {
                prev_word_end = word_end;
                line_width += word_width + blank_width;
                word_width = blank_width = 0.0f;
            }

            // Allow wrapping after punctuation.
            inside_word = !(c == '.' || c == ',' || c == ';' || c == '!' || c == '?' || c == '\"');
        }

        // We ignore blank width at the end of the line (they can be skipped)
        if (line_width + word_width >= wrap_width)
        {
            // Words that cannot possibly fit within an entire line will be cut anywhere.
            if (word_width < wrap_width)
                s = prev_word_end ? prev_word_end : word_end;
            break;
        }

        s = next_s;
    }

    return s;
}